

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

bool adjustKeyPresses<short>(TKeyPressCollectionT<short> *keyPresses,TSimilarityMap *sim)

{
  long lVar1;
  int iVar2;
  bool bVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
  *in_RSI;
  vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_> *in_RDI;
  reference rVar8;
  reference rVar9;
  int k1;
  int k0;
  value_type *curpair;
  int ip;
  int npairs;
  vector<bool,_std::allocator<bool>_> used;
  int nused;
  int j;
  int i;
  vector<Pair,_std::allocator<Pair>_> ccpairs;
  int n;
  bool res;
  undefined7 in_stack_fffffffffffffe38;
  undefined1 in_stack_fffffffffffffe3f;
  byte bVar10;
  __normal_iterator<Pair_*,_std::vector<Pair,_std::allocator<Pair>_>_> in_stack_fffffffffffffe48;
  __normal_iterator<Pair_*,_std::vector<Pair,_std::allocator<Pair>_>_> in_stack_fffffffffffffe50;
  vector<Pair,_std::allocator<Pair>_> *this;
  _Bit_type *in_stack_fffffffffffffe58;
  _Bit_type *__n;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffe60;
  bool local_149;
  reference local_120;
  reference local_110;
  reference local_100;
  reference local_f0;
  reference local_e0;
  reference local_d0;
  reference local_c0;
  int local_b0;
  int local_ac;
  reference local_a8;
  int local_a0;
  int local_9c;
  Pair *local_98;
  Pair *local_90;
  undefined1 local_81;
  int local_58;
  int local_48;
  int local_44;
  TValueCC local_40;
  int local_38;
  int local_34;
  vector<Pair,_std::allocator<Pair>_> local_30;
  int local_18;
  byte local_11;
  vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
  *local_10;
  vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_> *local_8;
  
  local_11 = 0;
  local_10 = in_RSI;
  local_8 = in_RDI;
  sVar4 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::size(in_RDI);
  local_18 = (int)sVar4;
  std::vector<Pair,_std::allocator<Pair>_>::vector((vector<Pair,_std::allocator<Pair>_> *)0x19de10);
  for (local_34 = 0; iVar2 = local_34, local_34 < local_18 + -1; local_34 = local_34 + 1) {
    while (local_38 = iVar2 + 1, local_38 < local_18) {
      local_48 = local_34;
      local_44 = local_38;
      pvVar5 = std::
               vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
               ::operator[](local_10,(long)local_34);
      pvVar6 = std::vector<stMatch,_std::allocator<stMatch>_>::operator[](pvVar5,(long)local_38);
      local_40 = pvVar6->cc;
      std::
      vector<adjustKeyPresses<short>(stKeyPressCollection<short>&,std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>&)::Pair,std::allocator<adjustKeyPresses<short>(stKeyPressCollection<short>&,std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>&)::Pair>>
      ::
      emplace_back<adjustKeyPresses<short>(stKeyPressCollection<short>&,std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>&)::Pair>
                ((vector<Pair,_std::allocator<Pair>_> *)in_stack_fffffffffffffe50._M_current,
                 in_stack_fffffffffffffe48._M_current);
      iVar2 = local_38;
    }
  }
  local_58 = 0;
  local_81 = 0;
  std::allocator<bool>::allocator((allocator<bool> *)0x19df3f);
  std::vector<bool,_std::allocator<bool>_>::vector
            (in_stack_fffffffffffffe60,(size_type)in_stack_fffffffffffffe58,
             (bool *)in_stack_fffffffffffffe50._M_current,
             (allocator_type *)in_stack_fffffffffffffe48._M_current);
  std::allocator<bool>::~allocator((allocator<bool> *)0x19df73);
  local_90 = (Pair *)std::vector<Pair,_std::allocator<Pair>_>::begin
                               ((vector<Pair,_std::allocator<Pair>_> *)
                                CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
  local_98 = (Pair *)std::vector<Pair,_std::allocator<Pair>_>::end
                               ((vector<Pair,_std::allocator<Pair>_> *)
                                CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
  std::
  sort<__gnu_cxx::__normal_iterator<adjustKeyPresses<short>(stKeyPressCollection<short>&,std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>&)::Pair*,std::vector<adjustKeyPresses<short>(stKeyPressCollection<short>&,std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>&)::Pair,std::allocator<adjustKeyPresses<short>(stKeyPressCollection<short>&,std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>&)::Pair>>>>
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  sVar4 = std::vector<Pair,_std::allocator<Pair>_>::size(&local_30);
  rVar9._M_mask = (_Bit_type)in_stack_fffffffffffffe50._M_current;
  rVar9._M_p = in_stack_fffffffffffffe58;
  local_9c = (int)sVar4;
  for (local_a0 = 0; local_a0 < local_9c; local_a0 = local_a0 + 1) {
    local_a8 = std::vector<Pair,_std::allocator<Pair>_>::operator[](&local_30,(long)local_a0);
    local_ac = local_a8->i;
    local_b0 = local_a8->j;
    rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      (in_stack_fffffffffffffe60,(size_type)rVar9._M_p);
    local_c0 = rVar8;
    bVar3 = std::_Bit_reference::operator_cast_to_bool(&local_c0);
    local_149 = false;
    if (bVar3) {
      rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        (in_stack_fffffffffffffe60,(size_type)rVar9._M_p);
      local_d0 = rVar8;
      local_149 = std::_Bit_reference::operator_cast_to_bool(&local_d0);
    }
    if (local_149 == false) {
      pvVar5 = std::
               vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
               ::operator[](local_10,(long)local_ac);
      pvVar6 = std::vector<stMatch,_std::allocator<stMatch>_>::operator[](pvVar5,(long)local_b0);
      if (pvVar6->offset != 0) {
        local_11 = 1;
      }
      rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        (in_stack_fffffffffffffe60,(size_type)rVar9._M_p);
      local_e0 = rVar8;
      bVar3 = std::_Bit_reference::operator_cast_to_bool(&local_e0);
      if (bVar3) {
        pvVar5 = std::
                 vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                 ::operator[](local_10,(long)local_ac);
        pvVar6 = std::vector<stMatch,_std::allocator<stMatch>_>::operator[](pvVar5,(long)local_b0);
        lVar1 = pvVar6->offset;
        pvVar7 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::
                 operator[](local_8,(long)local_ac);
        pvVar7->pos = pvVar7->pos - lVar1;
      }
      else {
        pvVar5 = std::
                 vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                 ::operator[](local_10,(long)local_ac);
        pvVar6 = std::vector<stMatch,_std::allocator<stMatch>_>::operator[](pvVar5,(long)local_b0);
        lVar1 = pvVar6->offset;
        pvVar7 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::
                 operator[](local_8,(long)local_b0);
        pvVar7->pos = lVar1 + pvVar7->pos;
      }
      pvVar5 = std::
               vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
               ::operator[](local_10,(long)local_ac);
      pvVar6 = std::vector<stMatch,_std::allocator<stMatch>_>::operator[](pvVar5,(long)local_b0);
      pvVar6->offset = 0;
      pvVar5 = std::
               vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
               ::operator[](local_10,(long)local_b0);
      pvVar6 = std::vector<stMatch,_std::allocator<stMatch>_>::operator[](pvVar5,(long)local_ac);
      pvVar6->offset = 0;
      rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        (in_stack_fffffffffffffe60,(size_type)rVar9._M_p);
      local_f0 = rVar8;
      bVar3 = std::_Bit_reference::operator_cast_to_bool(&local_f0);
      __n = rVar9._M_p;
      if (!bVar3) {
        rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          (in_stack_fffffffffffffe60,(size_type)__n);
        __n = rVar9._M_p;
        in_stack_fffffffffffffe60 = (vector<bool,_std::allocator<bool>_> *)rVar8._M_mask;
        local_100 = rVar8;
        std::_Bit_reference::operator=(&local_100,true);
        local_58 = local_58 + 1;
      }
      rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        (in_stack_fffffffffffffe60,(size_type)__n);
      local_110 = rVar9;
      bVar3 = std::_Bit_reference::operator_cast_to_bool(&local_110);
      if (!bVar3) {
        rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          (in_stack_fffffffffffffe60,(size_type)rVar9._M_p);
        local_120 = rVar8;
        std::_Bit_reference::operator=(&local_120,true);
        local_58 = local_58 + 1;
      }
      if (local_58 == local_18) break;
    }
  }
  this = (vector<Pair,_std::allocator<Pair>_> *)rVar9._M_mask;
  bVar10 = local_11;
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)0x19e460)
  ;
  std::vector<Pair,_std::allocator<Pair>_>::~vector(this);
  return (bool)(bVar10 & 1);
}

Assistant:

bool adjustKeyPresses(TKeyPressCollectionT<T> & keyPresses, TSimilarityMap & sim) {
    struct Pair {
        int i = -1;
        int j = -1;
        TValueCC cc = -1.0;

        bool operator < (const Pair & a) const { return cc > a.cc; }
    };

    bool res = false;

    int n = keyPresses.size();

    std::vector<Pair> ccpairs;
    for (int i = 0; i < n - 1; ++i) {
        for (int j = i + 1; j < n; ++j) {
            ccpairs.emplace_back(Pair{i, j, sim[i][j].cc});
        }
    }

    int nused = 0;
    std::vector<bool> used(n, false);

    std::sort(ccpairs.begin(), ccpairs.end());

    int npairs = ccpairs.size();
    for (int ip = 0; ip < npairs; ++ip) {
        auto & curpair = ccpairs[ip];
        int k0 = curpair.i;
        int k1 = curpair.j;
        if (used[k0] && used[k1]) continue;

        if (sim[k0][k1].offset != 0) res = true;

        if (used[k1] == false) {
            keyPresses[k1].pos += sim[k0][k1].offset;
        } else {
            keyPresses[k0].pos -= sim[k0][k1].offset;
        }

        sim[k0][k1].offset = 0;
        sim[k1][k0].offset = 0;

        if (used[k0] == false) { used[k0] = true; ++nused; }
        if (used[k1] == false) { used[k1] = true; ++nused; }

        if (nused == n) break;
    }

    return res;
}